

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::OneSlopeTestCase::testPolygonOffset(OneSlopeTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  void *pvVar7;
  long lVar8;
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  ShaderProgram program;
  Surface local_358;
  Surface local_340;
  undefined1 local_328 [24];
  float afStack_310 [2];
  undefined8 local_308;
  float local_300 [22];
  value_type local_2a8;
  undefined1 local_288 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270 [4];
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [208];
  ShaderProgram local_108;
  
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  local_300[8] = (float)iVar3;
  local_300[0] = -local_300[8];
  local_308 = 0xbf800000bf800000;
  local_300[1] = 1.0;
  local_300[2] = -1.0;
  local_300[3] = 1.0;
  local_300[5] = 1.0;
  local_300[6] = 1.0;
  local_300[7] = -1.0;
  local_300[9] = 1.0;
  local_300[10] = -1.0;
  local_300[0xb] = 1.0;
  local_300[0xd] = 1.0;
  local_300[0xe] = 1.0;
  local_300[0xf] = 1.0;
  local_300[0x11] = 1.0;
  local_300[0x12] = 1.0;
  local_300[0x13] = -1.0;
  local_300[0x15] = 1.0;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  local_300[4] = local_300[0];
  local_300[0xc] = local_300[8];
  local_300[0x10] = local_300[8];
  local_300[0x14] = local_300[0];
  tcu::Surface::Surface(&local_340,iVar3,iVar3);
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_358,iVar3,iVar3);
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Setup triangle0 coordinates: (slope in window coordinates = 1.0)",
             0x40);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_210);
  poVar1 = (ostringstream *)(local_288 + 8);
  lVar8 = 0xc;
  do {
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8 + -4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8 + 4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)&local_308 + lVar8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x3c);
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Setup triangle1 coordinates: (slope in window coordinates = 1.0)",
             0x40);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_210);
  poVar1 = (ostringstream *)(local_288 + 8);
  lVar8 = 0x3c;
  do {
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8 + -4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)afStack_310 + lVar8 + 4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)&local_308 + lVar8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x6c);
  iVar3 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_328._0_8_ = (long)local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",""
            );
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288,(value_type *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_270,&local_2a8);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar2,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_328._0_8_ != (long)local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  uVar4 = (**(code **)(lVar8 + 0x780))(local_108.m_program.m_program,"a_position");
  uVar5 = (**(code **)(lVar8 + 0x780))(local_108.m_program.m_program,"a_color");
  if (local_108.m_program.m_info.linkOk != false) {
    (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar8 + 0x188))(0x4000);
    (**(code **)(lVar8 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar8 + 0x1680))(local_108.m_program.m_program);
    (**(code **)(lVar8 + 0x5e0))(0xb71);
    (**(code **)(lVar8 + 0x5e0))(0x8037);
    (**(code **)(lVar8 + 0x610))(uVar4);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Framebuffer cleared, clear color = Black.",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Clear depth to 1.0.",0x13)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar8 + 0x1d0))(0x3f800000);
    (**(code **)(lVar8 + 0x188))(0x100);
    (**(code **)(lVar8 + 0x19f0))(uVar4,4,0x1406,0,0,&local_308);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)."
               ,0x73);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar8 + 0x1028))(0x41200000,0);
    (**(code **)(lVar8 + 0x4a0))(0x205);
    (**(code **)(lVar8 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar5);
    (**(code **)(lVar8 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Clear depth to 0.0.",0x13)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar8 + 0x1d0))(0);
    (**(code **)(lVar8 + 0x188))(0x100);
    (**(code **)(lVar8 + 0x19f0))(uVar4,4,0x1406,0,0,local_300 + 10);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)."
               ,0x76);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar8 + 0x1028))(0xc1200000,0);
    (**(code **)(lVar8 + 0x4a0))(0x205);
    (**(code **)(lVar8 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar5);
    (**(code **)(lVar8 + 0x538))(4,0,3);
    (**(code **)(lVar8 + 0x518))(uVar4);
    (**(code **)(lVar8 + 0x1680))(0);
    (**(code **)(lVar8 + 0x648))();
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    pvVar7 = (void *)local_340.m_pixels.m_cap;
    if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
      pvVar7 = local_340.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)local_328,local_340.m_width,
               local_340.m_height,1,pvVar7);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_288);
    glu::ShaderProgram::~ShaderProgram(&local_108);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting black framebuffer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    pvVar7 = (void *)local_358.m_pixels.m_cap;
    if ((void *)local_358.m_pixels.m_cap != (void *)0x0) {
      pvVar7 = local_358.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_108,local_358.m_width,
               local_358.m_height,1,pvVar7);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_288,(Vec4 *)&local_108);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
      local_340.m_pixels.m_cap = (size_t)local_340.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_108,local_340.m_width,
               local_340.m_height,1,(void *)local_340.m_pixels.m_cap);
    local_328._0_4_ = RGBA;
    local_328._4_4_ = UNORM_INT8;
    if ((void *)local_358.m_pixels.m_cap != (void *)0x0) {
      local_358.m_pixels.m_cap = (size_t)local_358.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_108,(TextureFormat *)local_328,local_358.m_width,
               local_358.m_height,1,(void *)local_358.m_pixels.m_cap);
    verifyImages((TestLog *)log,testCtx,pRVar2,(ConstPixelBufferAccess *)local_288,
                 (ConstPixelBufferAccess *)&local_108);
    tcu::Surface::~Surface(&local_358);
    tcu::Surface::~Surface(&local_340);
    return;
  }
  glu::operator<<((TestLog *)log,&local_108);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x464);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OneSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	/*
		* setup vertices subject to following properties
		*   dz_w / dx_w == 1
		*   dz_w / dy_w == 0
		* or
		*   dz_w / dx_w == 0
		*   dz_w / dy_w == 1
		* ==> m == 1
		*/
	const float cornerDepth = float(m_targetSize);
	const tcu::Vec4 triangles[2][3] =
	{
		{
			tcu::Vec4(-1, -1, -cornerDepth, 1),
			tcu::Vec4(-1,  1, -cornerDepth, 1),
			tcu::Vec4( 1, -1,  cornerDepth, 1),
		},
		{
			tcu::Vec4(-1,  1,  cornerDepth, 1),
			tcu::Vec4( 1,  1,  cornerDepth, 1),
			tcu::Vec4( 1, -1, -cornerDepth, 1),
		},
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log triangle info
	log << TestLog::Message << "Setup triangle0 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[0]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[0][ndx].x()
				<< "\ty=" << triangles[0][ndx].y()
				<< "\tz=" << triangles[0][ndx].z()
				<< "\tw=" << triangles[0][ndx].w()
				<< TestLog::EndMessage;
	log << TestLog::Message << "Setup triangle1 coordinates: (slope in window coordinates = 1.0)" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangles[1]); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangles[1][ndx].x()
				<< "\ty=" << triangles[1][ndx].y()
				<< "\tz=" << triangles[1][ndx].z()
				<< "\tw=" << triangles[1][ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clear					(GL_COLOR_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// top left (positive offset)
		{
			log << TestLog::Message << "Clear depth to 1.0." << TestLog::EndMessage;

			gl.clearDepthf			(1.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[0]);

			log << TestLog::Message << "Draw triangle0. Color = Red.\tState: DepthFunc = NOTEQUAL, PolygonOffset(10, 0). (Result depth should clamp to 1.0)." << TestLog::EndMessage;

			gl.polygonOffset		(10, 0);		// clamps any depth on the triangle to 1
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}
		// bottom right (negative offset)
		{
			log << TestLog::Message << "Clear depth to 0.0." << TestLog::EndMessage;

			gl.clearDepthf			(0.0f); // far
			gl.clear				(GL_DEPTH_BUFFER_BIT);

			gl.vertexAttribPointer	(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangles[1]);

			log << TestLog::Message << "Draw triangle1. Color = Green.\tState: DepthFunc = NOTEQUAL, PolygonOffset(-10, 0). (Result depth should clamp to 0.0)." << TestLog::EndMessage;

			gl.polygonOffset		(-10, 0); // clamps depth to 0
			gl.depthFunc			(GL_NOTEQUAL);
			gl.vertexAttrib4f		(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays			(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}